

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall wabt::AST::AST(AST *this,ModuleContext *mc,Func *f)

{
  undefined4 uVar1;
  Index IVar2;
  Index index;
  Variable local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
  local_98;
  string local_68;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Index i;
  Func *f_local;
  ModuleContext *mc_local;
  AST *this_local;
  
  this->mc = mc;
  std::vector<wabt::Node,_std::allocator<wabt::Node>_>::vector(&this->exp_stack);
  std::vector<wabt::Node,_std::allocator<wabt::Node>_>::vector(&this->predecls);
  this->f = f;
  this->value_stack_depth = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
  ::map(&this->vars_defined);
  this->flushed_vars = 0;
  this->cur_block_id = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->block_stack);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->blocks_closed);
  if (f != (Func *)0x0) {
    ModuleContext::BeginFunc(mc,f);
    for (name.field_2._12_4_ = 0; uVar1 = name.field_2._12_4_, IVar2 = Func::GetNumParams(f),
        (uint)uVar1 < IVar2; name.field_2._12_4_ = name.field_2._12_4_ + 1) {
      IndexToAlphaName_abi_cxx11_(&local_68,(wabt *)(ulong)(uint)name.field_2._12_4_,index);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "$",&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      local_a8.block_id = 0;
      local_a8.defined = false;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_a8);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
      ::insert(&this->vars_defined,&local_98);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
      ::~pair(&local_98);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  return;
}

Assistant:

AST(ModuleContext& mc, const Func* f) : mc(mc), f(f) {
    if (f) {
      mc.BeginFunc(*f);
      for (Index i = 0; i < f->GetNumParams(); i++) {
        auto name = "$" + IndexToAlphaName(i);
        vars_defined.insert({name, {0, false}});
      }
    }
  }